

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::PanelStyle> __thiscall gui::DefaultTheme::makePanelStyle(DefaultTheme *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Gui *in_RDI;
  shared_ptr<gui::PanelStyle> sVar1;
  shared_ptr<gui::PanelStyle> *style;
  Gui *this_00;
  
  this_00 = in_RDI;
  std::make_shared<gui::PanelStyle,gui::Gui_const&>(in_RDI);
  std::__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x222087);
  PanelStyle::setFillColor((PanelStyle *)this_00,(Color *)in_RDI);
  std::__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2220a2);
  PanelStyle::setOutlineColor((PanelStyle *)this_00,(Color *)in_RDI);
  std::__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2220bd);
  PanelStyle::setOutlineThickness((PanelStyle *)this_00,(float)((ulong)in_RDI >> 0x20));
  sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<gui::PanelStyle>)
         sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PanelStyle> DefaultTheme::makePanelStyle() const {
    auto style = std::make_shared<PanelStyle>(gui_);
    style->setFillColor(colorVeryLightGray);
    style->setOutlineColor(colorGray2);
    style->setOutlineThickness(-2.0f);

    return style;
}